

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeUnsizedArray * __thiscall
ExpressionContext::GetUnsizedArrayType(ExpressionContext *this,TypeBase *type)

{
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *type_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  MemberHandle *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  InplaceStr IVar3;
  TypeUnsizedArray *local_38;
  TypeUnsizedArray *this_00;
  undefined4 extraout_var_00;
  
  if (this->typeVoid == type) {
    __assert_fail("type != typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6d4,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
  }
  if (this->typeAuto == type) {
    __assert_fail("type != typeAuto",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6d7,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID - 0x1a < 3) {
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6da,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
    if (type->typeID == 0) {
      __assert_fail("!isType<TypeError>(type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6db,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
  }
  this_00 = type->unsizedArrayType;
  if (this_00 == (TypeUnsizedArray *)0x0) {
    if (0xffff < type->size) {
      __assert_fail("type->size < 64 * 1024",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6e0,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
    iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x90);
    this_00 = (TypeUnsizedArray *)CONCAT44(extraout_var,iVar1);
    IVar3 = GetUnsizedArrayTypeName(this,type);
    TypeUnsizedArray::TypeUnsizedArray(this_00,IVar3,type);
    PushScope(this,(TypeBase *)this_00);
    (this_00->super_TypeStruct).typeScope = this->scope;
    iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x28);
    node = (MemberHandle *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x170);
    allocator = this->allocator;
    scope = this->scope;
    type_00 = this->typeInt;
    iVar2 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
    IVar3.end = "";
    IVar3.begin = "size";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_02,iVar2),IVar3);
    uniqueId = this->uniqueVariableId;
    this->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              ((VariableData *)CONCAT44(extraout_var_01,iVar1),allocator,(SynBase *)0x0,scope,4,
               type_00,(SynIdentifier *)CONCAT44(extraout_var_02,iVar2),8,uniqueId);
    node->source = (SynBase *)0x0;
    node->variable = (VariableData *)CONCAT44(extraout_var_01,iVar1);
    node->initializer = (SynBase *)0x0;
    node->next = (MemberHandle *)0x0;
    node->listed = false;
    IntrusiveList<MemberHandle>::push_back(&(this_00->super_TypeStruct).members,node);
    ((this_00->super_TypeStruct).members.tail)->variable->isReadonly = true;
    (this_00->super_TypeStruct).super_TypeBase.alignment = 4;
    (this_00->super_TypeStruct).super_TypeBase.size = 0xc;
    PopScope(this,SCOPE_TYPE);
    type->unsizedArrayType = this_00;
    local_38 = this_00;
    SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_38);
  }
  return this_00;
}

Assistant:

TypeUnsizedArray* ExpressionContext::GetUnsizedArrayType(TypeBase* type)
{
	// Can't have array of void
	assert(type != typeVoid);

	// Can't create array of auto types this way
	assert(type != typeAuto);

	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	if(type->unsizedArrayType)
		return type->unsizedArrayType;

	assert(type->size < 64 * 1024);

	// Create new type
	TypeUnsizedArray* result = new (get<TypeUnsizedArray>()) TypeUnsizedArray(GetUnsizedArrayTypeName(*this, type), type);

	PushScope(result);

	result->typeScope = scope;

	result->members.push_back(new (get<MemberHandle>()) MemberHandle(NULL, new (get<VariableData>()) VariableData(allocator, NULL, scope, 4, typeInt, new (get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), NULLC_PTR_SIZE, uniqueVariableId++), NULL));
	result->members.tail->variable->isReadonly = true;

	result->alignment = 4;
	result->size = NULLC_PTR_SIZE + 4;

	PopScope(SCOPE_TYPE);

	// Save it for future use
	type->unsizedArrayType = result;

	types.push_back(result);

	return result;
}